

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

_Bool is_transfer_type_by_descriptor(AMQP_VALUE descriptor)

{
  int iVar1;
  uint64_t descriptor_ulong;
  uint64_t local_10;
  
  iVar1 = amqpvalue_get_ulong(descriptor,&local_10);
  return local_10 == 0x14 && iVar1 == 0;
}

Assistant:

bool is_transfer_type_by_descriptor(AMQP_VALUE descriptor)
{
    bool result;

    uint64_t descriptor_ulong;
    if ((amqpvalue_get_ulong(descriptor, &descriptor_ulong) == 0) &&
        (descriptor_ulong == 20))
    {
        result = true;
    }
    else
    {
        result = false;
    }

    return result;
}